

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.cpp
# Opt level: O2

string * hmac::get_hash(string *__return_storage_ptr__,string *input,TypeHash type)

{
  long lVar1;
  EVP_PKEY_CTX *pEVar2;
  uint8_t *puVar3;
  uint8_t digest [20];
  SHA256 ctx;
  uint8_t local_1b8 [64];
  undefined1 local_178 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_158 [13];
  
  if (type == SHA512) {
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
      local_1b8[lVar1] = '\0';
    }
    puVar3 = local_178;
    pEVar2 = (EVP_PKEY_CTX *)0x0;
    memset((SHA512 *)local_178,0,0x150);
    hmac_hash::SHA512::init((SHA512 *)local_178,pEVar2);
    hmac_hash::SHA512::update
              ((SHA512 *)local_178,(uint8_t *)(input->_M_dataplus)._M_p,input->_M_string_length);
    hmac_hash::SHA512::finish((SHA512 *)local_178,local_1b8);
  }
  else {
    if (type != SHA256) {
      if (type == SHA1) {
        for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 1) {
          local_1b8[lVar1] = '\0';
        }
        local_158[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178[0x10] = '\0';
        local_178[0x11] = '\0';
        local_178[0x12] = '\0';
        local_178[0x13] = '\0';
        local_178[0x14] = '\0';
        local_178[0x15] = '\0';
        local_178[0x16] = '\0';
        local_178[0x17] = '\0';
        local_178._24_8_ = 0;
        local_178._0_8_ = 0;
        local_178._8_8_ = 0;
        local_158[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        hmac_hash::SHA1::init((SHA1 *)local_178,(EVP_PKEY_CTX *)input);
        hmac_hash::SHA1::update
                  ((SHA1 *)local_178,(uchar *)(input->_M_dataplus)._M_p,input->_M_string_length);
        hmac_hash::SHA1::finish((SHA1 *)local_178,local_1b8);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,local_1b8,local_1b8 + 0x14);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(local_158);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      local_1b8[lVar1] = '\0';
    }
    puVar3 = local_1b8 + 0x20;
    pEVar2 = (EVP_PKEY_CTX *)0x0;
    memset((SHA256 *)local_178,0,0xb0);
    hmac_hash::SHA256::init((SHA256 *)local_178,pEVar2);
    hmac_hash::SHA256::update
              ((SHA256 *)local_178,(uchar *)(input->_M_dataplus)._M_p,input->_M_string_length);
    hmac_hash::SHA256::finish((SHA256 *)local_178,local_1b8);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_1b8,puVar3)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string get_hash(const std::string &input, TypeHash type) {
        switch(type) {
            case TypeHash::SHA1: {
                uint8_t digest[hmac_hash::SHA1::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA1::DIGEST_SIZE, '\0');
                hmac_hash::SHA1 ctx = hmac_hash::SHA1();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA1::DIGEST_SIZE);
            }
            case TypeHash::SHA256: {
                uint8_t digest[hmac_hash::SHA256::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA256::DIGEST_SIZE, '\0');
                hmac_hash::SHA256 ctx = hmac_hash::SHA256();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA256::DIGEST_SIZE);
            }
            case TypeHash::SHA512: {
                uint8_t digest[hmac_hash::SHA512::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA512::DIGEST_SIZE, '\0');
                hmac_hash::SHA512 ctx = hmac_hash::SHA512();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA512::DIGEST_SIZE);
            }
            default: break;
        };
        return std::string();
    }